

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void iqxmlrpc::http::validator::unsigned_number(string *val)

{
  bool bVar1;
  Malformed_packet *this;
  allocator<char> local_79;
  string local_78;
  is_classifiedF local_58;
  char errmsg [29];
  
  builtin_strncpy(errmsg + 0x10,"meric option",0xd);
  builtin_strncpy(errmsg,"bad format of nu",0x10);
  std::locale::locale((locale *)&local_78);
  boost::algorithm::is_digit((locale *)&local_58);
  bVar1 = boost::algorithm::all<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                    (val,&local_58);
  std::locale::~locale(&local_58.m_Locale);
  std::locale::~locale((locale *)&local_78);
  if (bVar1) {
    boost::lexical_cast<unsigned_int,std::__cxx11::string>(val);
    return;
  }
  this = (Malformed_packet *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,errmsg,&local_79);
  Malformed_packet::Malformed_packet(this,&local_78);
  __cxa_throw(this,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void unsigned_number(const std::string& val)
{
  const char errmsg[] = "bad format of numeric option";

  try {
    if (!boost::all(val, boost::is_digit()))
      throw Malformed_packet(errmsg);

    boost::lexical_cast<unsigned>(val);
  } catch (const boost::bad_lexical_cast&) {
    throw Malformed_packet(errmsg);
  }
}